

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::TightenBoundsPS::TightenBoundsPS
          (TightenBoundsPS *this,TightenBoundsPS *old)

{
  double dVar1;
  
  PostStep::PostStep(&this->super_PostStep,&old->super_PostStep);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_00334470;
  this->m_j = old->m_j;
  dVar1 = old->m_origlower;
  this->m_origupper = old->m_origupper;
  this->m_origlower = dVar1;
  return;
}

Assistant:

TightenBoundsPS(const TightenBoundsPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_origupper(old.m_origupper)
         , m_origlower(old.m_origlower)
      {}